

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_iscatterv_(void *sendbuf,int *sendcounts,int *displs,MPIABI_Fint *sendtype,void *recvbuf
                      ,MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *root,
                      MPIABI_Fint *comm,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  MPIABI_Fint *recvcount_local;
  void *recvbuf_local;
  MPIABI_Fint *sendtype_local;
  int *displs_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  mpi_iscatterv_(sendbuf,sendcounts,displs,sendtype,recvbuf,recvcount,recvtype,root,comm,request,
                 ierror);
  return;
}

Assistant:

void mpiabi_iscatterv_(
  const void * sendbuf,
  const int * sendcounts,
  const int * displs,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_iscatterv_(
    sendbuf,
    sendcounts,
    displs,
    sendtype,
    recvbuf,
    recvcount,
    recvtype,
    root,
    comm,
    request,
    ierror
  );
}